

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O3

int kvtree_file_unlock(char *file,int fd)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  iVar1 = flock(fd,8);
  if (iVar1 != 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",file,fd,8,
               (ulong)__errnum,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xb9);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int kvtree_file_unlock(const char* file, int fd)
{
  #ifdef KVTREE_FILE_LOCK_USE_FLOCK
    if (flock(fd, LOCK_UN) != 0) {
      kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",
        file, fd, LOCK_UN, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  #ifdef KVTREE_FILE_LOCK_USE_FCNTL
    struct flock lck;
    lck.l_type = F_UNLCK;
    lck.l_whence = 0;
    lck.l_start = 0L;
    lck.l_len = 0L; //locking the entire file

    if(fcntl(fd, F_SETLK, &lck) < 0) {
      kvtree_err("Failed to acquire file read lock on %s: fnctl(%d, %d) errno=%d %s @ %s:%d",
        file, fd, F_UNLCK, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  return KVTREE_SUCCESS;
}